

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O1

void __thiscall fizplex::LPTest_AddRowFromRow_Test::TestBody(LPTest_AddRowFromRow_Test *this)

{
  Row row;
  bool bVar1;
  size_t sVar2;
  Row *pRVar3;
  char *in_R9;
  AssertionResult gtest_ar_;
  Row r;
  LP lp;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  AssertHelper local_e0;
  internal local_d8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  string local_c8;
  Row local_a8;
  LP local_90;
  
  LP::LP(&local_90);
  LP::Row::Row(&local_a8,LE,-1.33333,302.0);
  row.lower = local_a8.lower;
  row.type = local_a8.type;
  row._4_4_ = local_a8._4_4_;
  row.upper = local_a8.upper;
  LP::add_row(&local_90,row);
  sVar2 = LP::row_count(&local_90);
  local_d8[0] = (internal)(sVar2 == 1);
  local_d0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_d8[0]) {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,local_d8,(AssertionResult *)"lp.row_count() == 1","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x51,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_e8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_e8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_e8.ptr_ + 8))();
      }
      local_e8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pRVar3 = LP::row_header(&local_90,0);
  local_d8[0] = (internal)(pRVar3->type == LE);
  local_d0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_d8[0]) {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,local_d8,(AssertionResult *)"lp.row_header(0u).type == RowType::LE","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x52,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_e8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_e8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_e8.ptr_ + 8))();
      }
      local_e8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_90.rows.super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.rows.
                    super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.rows.
                          super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.rows.
                          super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.cols.super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.cols.
                    super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.cols.
                          super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.cols.
                          super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(local_90.c.vals._M_data);
  operator_delete(local_90.b.vals._M_data);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector
            ((vector<fizplex::SVector,_std::allocator<fizplex::SVector>_> *)&local_90);
  return;
}

Assistant:

TEST(LPTest, AddRowFromRow) {
  LP lp;
  LP::Row r(RowType::LE, -1.33333, 302);
  lp.add_row(r);
  EXPECT_TRUE(lp.row_count() == 1);
  EXPECT_TRUE(lp.row_header(0u).type == RowType::LE);
}